

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::CheckAssertReturnResult
          (CommandRunner *this,AssertReturnCommand *command,int index,ExpectedValue expected,
          TypedValue actual,bool print_error)

{
  uint32_t uVar1;
  ulong uVar2;
  ExpectedValue expected_00;
  TypedValue actual_00;
  Type lane_type;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  Result RVar5;
  uint uVar6;
  undefined4 in_register_00000014;
  uint *ev;
  TypedValue *tv;
  ExpectedValue *ev_00;
  TypedValue *tv_00;
  ExpectedValue *extraout_RDX;
  uint lane;
  bool bVar7;
  TypedValue lane_actual;
  ExpectedValue lane_expected;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ExpectedValue local_a8;
  string local_70;
  string local_50;
  
  lane_type.enum_ = expected.lane_type.enum_;
  ev = (uint *)CONCAT44(in_register_00000014,index);
  uVar2 = actual.value.field_0._0_8_;
  if (expected.value.type.enum_ != actual.type.enum_) {
    if (expected.value.type.enum_ != ExternRef) {
      if (expected.value.type.enum_ != FuncRef) {
        if (expected.value.type.enum_ != ExnRef) {
          __assert_fail("expected.value.type == actual.type || IsReference(expected.value.type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                        ,0x67e,
                        "wabt::Result spectest::CommandRunner::CheckAssertReturnResult(const AssertReturnCommand *, int, ExpectedValue, TypedValue, bool)"
                       );
        }
        goto switchD_00173724_caseD_fffffff1;
      }
      goto switchD_00173724_caseD_fffffff0;
    }
switchD_00173724_caseD_ffffffef:
    if ((expected.value.value.type.enum_ != ExternRef) && (expected.value.value.type.enum_ != Any))
    goto LAB_00173ae9;
    if (actual.value.type.enum_ != ExternRef) goto LAB_00173781;
    goto LAB_00173789;
  }
  ev = &switchD_00173724::switchdataD_001d00d0;
  switch(expected.value.type.enum_) {
  case ExternRef:
    goto switchD_00173724_caseD_ffffffef;
  case FuncRef:
switchD_00173724_caseD_fffffff0:
    bVar7 = actual.type.enum_ == FuncRef;
    break;
  default:
switchD_00173724_caseD_fffffff1:
    abort();
  case I16:
  case I8:
  case I32:
    if ((1 < (uint)(expected.value.value.type.enum_ + ~I64)) ||
       (1 < (uint)(actual.value.type.enum_ + ~I64))) goto LAB_00173ae9;
LAB_00173746:
    bVar7 = expected.value.value.field_0.i32_ == actual.value.field_0.i32_;
    break;
  case V128:
    LaneCountFromType(expected.lane_type);
    bVar7 = true;
    lane = 0;
    do {
      GetLane(&local_a8,&expected,lane);
      GetLane((TypedValue *)local_c8,&actual,lane_type,lane);
      expected_00.value.value.field_0.i64_ = local_a8.value.value.field_0.i64_;
      expected_00.value.type.enum_ = local_a8.value.type.enum_;
      expected_00.value._4_4_ = local_a8.value._4_4_;
      expected_00.value.value.field_0._8_8_ = local_a8.value.value.field_0._8_8_;
      expected_00.value.value.type.enum_ = local_a8.value.value.type.enum_;
      expected_00.value.value._20_4_ = local_a8.value.value._20_4_;
      expected_00.lane_type.enum_ = local_a8.lane_type.enum_;
      expected_00.nan[0] = local_a8.nan[0];
      expected_00.nan[1] = local_a8.nan[1];
      expected_00.nan[2] = local_a8.nan[2];
      expected_00.nan[3] = local_a8.nan[3];
      expected_00._52_4_ = local_a8._52_4_;
      actual_00.value.field_0.i64_ = local_c8._8_8_;
      actual_00._0_8_ = local_c8._0_8_;
      actual_00.value.field_0._8_8_ = local_b8._M_allocated_capacity;
      actual_00.value._16_8_ = local_b8._8_8_;
      RVar5 = CheckAssertReturnResult(this,command,index,expected_00,actual_00,false);
      if (RVar5.enum_ == Error) {
        uVar1 = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
        ExpectedValueToString_abi_cxx11_(&local_50,(spectest *)&local_a8,ev_00);
        _Var4._M_p = local_50._M_dataplus._M_p;
        wabt::interp::TypedValueToString_abi_cxx11_(&local_70,(interp *)local_c8,tv_00);
        PrintError(this,uVar1,
                   "mismatch in lane %u of result %u of assert_return: expected %s, got %s",
                   (ulong)lane,(ulong)(uint)index,_Var4._M_p,local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        bVar7 = false;
      }
      lane = lane + 1;
      uVar6 = LaneCountFromType(lane_type);
      ev = (uint *)extraout_RDX;
    } while (lane < uVar6);
    break;
  case F64:
    if (expected.nan[0] != None) {
      if (expected.nan[0] == Canonical) {
        if ((actual.value.type.enum_ != F64) && (actual.value.type.enum_ != Any)) goto LAB_00173ae9;
        bVar7 = (uVar2 & 0x7fffffffffffffff) == 0x7ff8000000000000;
      }
      else {
        bVar7 = true;
        if (expected.nan[0] != Arithmetic) goto LAB_00173818;
        if ((actual.value.type.enum_ != F64) && (actual.value.type.enum_ != Any)) goto LAB_00173ae9;
        bVar7 = (~uVar2 & 0x7ff8000000000000) == 0;
      }
      break;
    }
    if ((expected.value.value.type.enum_ != F64) && (expected.value.value.type.enum_ != Any))
    goto LAB_00173ae9;
    if (actual.value.type.enum_ != F64) goto LAB_00173781;
    goto LAB_00173789;
  case F32:
    if (expected.nan[0] == None) {
      if (((expected.value.value.type.enum_ != F32) && (expected.value.value.type.enum_ != Any)) ||
         ((actual.value.type.enum_ != F32 && (actual.value.type.enum_ != Any)))) goto LAB_00173ae9;
      goto LAB_00173746;
    }
    if (expected.nan[0] == Canonical) {
      if ((actual.value.type.enum_ != F32) && (actual.value.type.enum_ != Any)) goto LAB_00173ae9;
      bVar7 = (actual.value.field_0.i32_ & 0x7fffffff) == 0x7fc00000;
    }
    else {
      bVar7 = true;
      if (expected.nan[0] != Arithmetic) goto LAB_00173818;
      if ((actual.value.type.enum_ != F32) && (actual.value.type.enum_ != Any)) goto LAB_00173ae9;
      bVar7 = (~actual.value.field_0.i32_ & 0x7fc00000) == 0;
    }
    break;
  case I64:
    if ((expected.value.value.type.enum_ != I64) && (expected.value.value.type.enum_ != Any))
    goto LAB_00173ae9;
    if (actual.value.type.enum_ == I64) goto LAB_00173789;
LAB_00173781:
    if (actual.value.type.enum_ != Any) {
LAB_00173ae9:
      __assert_fail("t == type || type == ValueType::Any",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.h"
                    ,0x22d,"void wabt::interp::Value::CheckType(ValueType) const");
    }
LAB_00173789:
    bVar7 = expected.value.value.field_0._0_8_ == uVar2;
  }
  if ((~print_error & 1U) == 0 && !bVar7) {
    uVar1 = (command->super_CommandMixin<(wabt::CommandType)7>).super_Command.line;
    ExpectedValueToString_abi_cxx11_((string *)&local_a8,(spectest *)&expected,(ExpectedValue *)ev);
    uVar3 = local_a8.value._0_8_;
    wabt::interp::TypedValueToString_abi_cxx11_((string *)local_c8,(interp *)&actual,tv);
    PrintError(this,uVar1,"mismatch in result %u of assert_return: expected %s, got %s",
               (ulong)(uint)index,uVar3,local_c8._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ != &local_b8) {
      operator_delete((void *)local_c8._0_8_);
    }
    if (local_a8.value._0_8_ != (long)&local_a8.value.value.field_0.v128_ + 8U) {
      operator_delete((void *)local_a8.value._0_8_);
    }
    bVar7 = false;
  }
LAB_00173818:
  return (Result)(uint)(byte)~bVar7;
}

Assistant:

wabt::Result CommandRunner::CheckAssertReturnResult(
    const AssertReturnCommand* command,
    int index,
    ExpectedValue expected,
    TypedValue actual,
    bool print_error) {
  assert(expected.value.type == actual.type ||
         IsReference(expected.value.type));
  bool ok = true;
  switch (expected.value.type) {
    case Type::I8:
    case Type::I16:
    case Type::I32:
      ok = expected.value.value.Get<u32>() == actual.value.Get<u32>();
      break;

    case Type::I64:
      ok = expected.value.value.Get<u64>() == actual.value.Get<u64>();
      break;

    case Type::F32:
      switch (expected.nan[0]) {
        case ExpectedNan::Arithmetic:
          ok = IsArithmeticNan(actual.value.Get<f32>());
          break;

        case ExpectedNan::Canonical:
          ok = IsCanonicalNan(actual.value.Get<f32>());
          break;

        case ExpectedNan::None:
          ok = Bitcast<u32>(expected.value.value.Get<f32>()) ==
               Bitcast<u32>(actual.value.Get<f32>());
          break;
      }
      break;

    case Type::F64:
      switch (expected.nan[0]) {
        case ExpectedNan::Arithmetic:
          ok = IsArithmeticNan(actual.value.Get<f64>());
          break;

        case ExpectedNan::Canonical:
          ok = IsCanonicalNan(actual.value.Get<f64>());
          break;

        case ExpectedNan::None:
          ok = Bitcast<u64>(expected.value.value.Get<f64>()) ==
               Bitcast<u64>(actual.value.Get<f64>());
          break;
      }
      break;

    case Type::V128: {
      // Compare each lane as if it were its own value.
      for (int lane = 0; lane < LaneCountFromType(expected.lane_type); ++lane) {
        ExpectedValue lane_expected = GetLane(expected, lane);
        TypedValue lane_actual = GetLane(actual, expected.lane_type, lane);

        if (Failed(CheckAssertReturnResult(command, index, lane_expected,
                                           lane_actual, false))) {
          PrintError(command->line,
                     "mismatch in lane %u of result %u of assert_return: "
                     "expected %s, got %s",
                     lane, index, ExpectedValueToString(lane_expected).c_str(),
                     TypedValueToString(lane_actual).c_str());
          ok = false;
        }
      }
      break;
    }

    case Type::FuncRef:
      // A funcref expectation only requires that the reference be a function,
      // but it doesn't check the actual index.
      ok = (actual.type == Type::FuncRef);
      break;

    case Type::ExternRef:
      ok = expected.value.value.Get<Ref>() == actual.value.Get<Ref>();
      break;

    default:
      WABT_UNREACHABLE;
  }

  if (!ok && print_error) {
    PrintError(command->line,
               "mismatch in result %u of assert_return: expected %s, got %s",
               index, ExpectedValueToString(expected).c_str(),
               TypedValueToString(actual).c_str());
  }
  return ok ? wabt::Result::Ok : wabt::Result::Error;
}